

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::fileOutPut(Process *this,vector<int,_std::allocator<int>_> *distribution)

{
  ostream *poVar1;
  reference pvVar2;
  int local_21c;
  ostream local_218 [4];
  int i;
  ofstream LayerOutput;
  vector<int,_std::allocator<int>_> *distribution_local;
  Process *this_local;
  
  std::ofstream::ofstream(local_218,"../Results/Distibution.txt",0x10);
  for (local_21c = 0; (double)local_21c * this->tau < (double)this->T; local_21c = local_21c + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(local_218,(double)local_21c * this->tau);
    poVar1 = std::operator<<(poVar1,"\t\t");
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](distribution,(long)local_21c);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Process::fileOutPut(std::vector<int> distribution){
    std::ofstream LayerOutput("../Results/Distibution.txt");
            for (int i = 0; i*tau < T; i++) {
                LayerOutput << i * tau << "\t\t" << distribution[i] << std::endl;
            }

}